

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSelector.cpp
# Opt level: O1

void Kernel::LiteralSelector::ensureSomeColoredSelected(Clause *c,uint eligible)

{
  ulong uVar1;
  Literal *pLVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  if ((~*(uint *)&c->field_0x38 & 0x300000) == 0) {
    Clause::computeColor(c);
  }
  uVar1 = *(ulong *)&c->field_0x38;
  if ((uVar1 & 0x300000) != 0) {
    uVar3 = (uint)(uVar1 >> 0x20);
    uVar4 = uVar3 & 0xfffff;
    if ((uVar1 & 0xfffff00000000) != 0) {
      lVar5 = 0;
      do {
        if (((c->_literals[lVar5]->super_Term).field_0xf & 0x30) != 0) {
          return;
        }
        lVar5 = lVar5 + 1;
      } while ((uVar3 & 0xfffff) != (uint)lVar5);
    }
    if (uVar4 < eligible) {
      do {
        if (((c->_literals[(int)uVar4]->super_Term).field_0xf & 0x30) != 0) {
          pLVar2 = c->_literals[uVar3 & 0xfffff];
          c->_literals[uVar3 & 0xfffff] = c->_literals[(int)uVar4];
          c->_literals[(int)uVar4] = pLVar2;
          *(ulong *)&c->field_0x38 =
               *(ulong *)&c->field_0x38 & 0xfff00000ffffffff | uVar1 + 0x100000000 & 0xfffff00000000
          ;
          Clause::notifyLiteralReorder(c);
          return;
        }
        uVar4 = uVar4 + 1;
      } while (eligible != uVar4);
    }
  }
  return;
}

Assistant:

void LiteralSelector::ensureSomeColoredSelected(Clause* c, unsigned eligible)
{
  if(c->color()==COLOR_TRANSPARENT) {
    //if no literal is colored, do nothing
    return;
  }

  unsigned selCnt=c->numSelected();

  for(unsigned i=0;i<selCnt;i++) {
    if((*c)[i]->color()!=COLOR_TRANSPARENT) {
      return;
    }
  }

  for(unsigned i=selCnt;i<eligible;i++) {
    if((*c)[i]->color()!=COLOR_TRANSPARENT) {
      swap((*c)[selCnt], (*c)[i]);
      c->setSelected(selCnt+1);
      return;
    }
  }

  ASS(eligible < c->length() || //the colored literals are not among the eligible ones ...
      c->splits());             // .. unless the color comes from the propositional part
}